

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populationTest.cpp
# Opt level: O1

int main(void)

{
  SpikingPopulation *this;
  SpikingPopulation *this_00;
  Clock *pCVar1;
  Clock *this_01;
  int i;
  int iVar2;
  string local_68;
  string local_48;
  
  this = (SpikingPopulation *)operator_new(0x60);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"izhikevich","");
  SpikingPopulation::SpikingPopulation(this,1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_00 = (SpikingPopulation *)operator_new(0x60);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CurrentGenerator","");
  SpikingPopulation::SpikingPopulation(this_00,1,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pCVar1 = Clock::getInstance();
  Clock::getCurrentTime(pCVar1);
  pCVar1 = Clock::getInstance();
  Clock::setDt(pCVar1,0.01);
  iVar2 = 0;
  do {
    Clock::tick(pCVar1);
    if ((iVar2 == 600) || (iVar2 == 100)) {
      this_01 = Clock::getInstance();
      Clock::getCurrentTime(this_01);
    }
    (**(this_00->super_Population)._vptr_Population)(this_00);
    (*(this->super_Population)._vptr_Population[5])
              (this,0,*(this_00->super_Population).output.
                       super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
    (**(this->super_Population)._vptr_Population)(this);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 1000);
  return 0;
}

Assistant:

int main() 
{
    SpikingPopulation* p1 = new SpikingPopulation(1, "izhikevich");
    SpikingPopulation* p2 = new SpikingPopulation(1, "CurrentGenerator");

    Event* e = new NoEvent();

    Clock* clock = Clock::getInstance();
    clock->setDt(0.01);

    for(int i = 0; i < 1000; i++) {
        clock->tick();
        if(i == 100) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 600) {
            e = new NoEvent();
        }
        p2->update();

        p1->setInput(0, p2->output[0]);
        p1->update();

    }
    return 0;
}